

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O0

void slang::ast::addBlockMembers(GenerateBlockSymbol *block,SyntaxNode *syntax)

{
  GenerateBlockSyntax *pGVar1;
  iterator ppMVar2;
  MemberSyntax *member;
  iterator __end3;
  iterator __begin3;
  SyntaxList<slang::syntax::MemberSyntax> *__range3;
  SyntaxNode *syntax_local;
  GenerateBlockSymbol *block_local;
  
  if (syntax->kind == GenerateBlock) {
    pGVar1 = slang::syntax::SyntaxNode::as<slang::syntax::GenerateBlockSyntax>(syntax);
    __end3 = nonstd::span_lite::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::begin
                       (&(pGVar1->members).
                         super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>);
    ppMVar2 = nonstd::span_lite::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::end
                        (&(pGVar1->members).
                          super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>);
    for (; __end3 != ppMVar2; __end3 = __end3 + 1) {
      Scope::addMembers(&block->super_Scope,&(*__end3)->super_SyntaxNode);
    }
  }
  else {
    Scope::addMembers(&block->super_Scope,syntax);
  }
  return;
}

Assistant:

static void addBlockMembers(GenerateBlockSymbol& block, const SyntaxNode& syntax) {
    if (syntax.kind != SyntaxKind::GenerateBlock) {
        block.addMembers(syntax);
    }
    else {
        for (auto member : syntax.as<GenerateBlockSyntax>().members)
            block.addMembers(*member);
    }
}